

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O0

float FBaseCVar::ToFloat(UCVarValue value,ECVarType type)

{
  double dVar1;
  int iStack_18;
  ECVarType type_local;
  UCVarValue value_local;
  
  iStack_18 = value.Int;
  switch(type) {
  case CVAR_Bool:
    iStack_18._0_1_ = value.Bool;
    value_local._4_4_ = (undefined4)(iStack_18._0_1_ & 1);
    break;
  case CVAR_Int:
    value_local._4_4_ = (undefined4)iStack_18;
    break;
  case CVAR_Float:
    value_local._4_4_ = iStack_18;
    break;
  case CVAR_String:
    dVar1 = strtod(value.String,(char **)0x0);
    value_local._4_4_ = (undefined4)dVar1;
    break;
  default:
    value_local._4_4_ = 0;
    break;
  case CVAR_GUID:
    value_local._4_4_ = 0;
  }
  return value_local._4_4_;
}

Assistant:

float FBaseCVar::ToFloat (UCVarValue value, ECVarType type)
{
	switch (type)
	{
	case CVAR_Bool:
		return (float)value.Bool;

	case CVAR_Int:
		return (float)value.Int;

	case CVAR_Float:
		return value.Float;

	case CVAR_String:
		return (float)strtod (value.String, NULL);

	case CVAR_GUID:
		return 0.f;

	default:
		return 0.f;
	}
}